

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::DeleteFlatMap(KeyValue *flat,uint16_t flat_capacity)

{
  undefined6 in_register_00000032;
  
  operator_delete__(flat,(ulong)(uint)((int)CONCAT62(in_register_00000032,flat_capacity) << 5));
  return;
}

Assistant:

void ExtensionSet::DeleteFlatMap(const ExtensionSet::KeyValue* flat,
                                 uint16_t flat_capacity) {
  // Arena::CreateArray already requires a trivially destructible type, but
  // ensure this constraint is not violated in the future.
  static_assert(std::is_trivially_destructible<KeyValue>::value,
                "CreateArray requires a trivially destructible type");
  // A const-cast is needed, but this is safe as we are about to deallocate the
  // array.
  internal::SizedArrayDelete(const_cast<KeyValue*>(flat),
                             sizeof(*flat) * flat_capacity);
}